

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O0

ps_mgau_t * ptm_mgau_init(acmod_t *acmod,bin_mdef_t *mdef)

{
  int iVar1;
  ptm_mgau_t *s_00;
  logmath_t *plVar2;
  char *pcVar3;
  char *varfile;
  gauden_t *pgVar4;
  long lVar5;
  uint8 *puVar6;
  ptm_fast_eval_t *ppVar7;
  float64 base;
  double dVar8;
  uint32 local_78;
  uint32 local_74;
  uint32 local_6c;
  uint32 local_68;
  uint local_60;
  int local_58;
  int local_3c;
  int i;
  char *sendump_path;
  ps_mgau_t *ps;
  ptm_mgau_t *s;
  bin_mdef_t *mdef_local;
  acmod_t *acmod_local;
  
  s_00 = (ptm_mgau_t *)
         __ckd_calloc__(1,0x78,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x325);
  s_00->config = acmod->config;
  plVar2 = logmath_retain(acmod->lmath);
  s_00->lmath = plVar2;
  base = logmath_get_base(acmod->lmath);
  plVar2 = logmath_init(base,10,1);
  s_00->lmath_8b = plVar2;
  if (s_00->lmath_8b != (logmath_t *)0x0) {
    iVar1 = logmath_get_width(s_00->lmath_8b);
    if (iVar1 == 1) {
      pcVar3 = ps_config_str(s_00->config,"mean");
      varfile = ps_config_str(s_00->config,"var");
      dVar8 = ps_config_float(s_00->config,"varfloor");
      pgVar4 = gauden_init(pcVar3,varfile,(float32)(float)dVar8,s_00->lmath);
      s_00->g = pgVar4;
      if (pgVar4 == (gauden_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x339,"Failed to read means and variances\n");
      }
      else if (s_00->g->n_mgau < 0x101) {
        if (s_00->g->n_mgau == mdef->n_ciphone) {
          if (acmod->fcb->n_sv == 0) {
            local_58 = acmod->fcb->n_stream;
          }
          else {
            local_58 = acmod->fcb->n_sv;
          }
          if (s_00->g->n_feat == local_58) {
            for (local_3c = 0; local_3c < s_00->g->n_feat; local_3c = local_3c + 1) {
              if (acmod->fcb->lda == (mfcc_t ***)0x0) {
                if (acmod->fcb->sv_len == (uint32 *)0x0) {
                  local_6c = acmod->fcb->stream_len[local_3c];
                }
                else {
                  local_6c = acmod->fcb->sv_len[local_3c];
                }
                local_68 = local_6c;
              }
              else {
                local_68 = acmod->fcb->out_dim;
              }
              if (s_00->g->featlen[local_3c] != local_68) {
                if (acmod->fcb->lda == (mfcc_t ***)0x0) {
                  if (acmod->fcb->sv_len == (uint32 *)0x0) {
                    local_78 = acmod->fcb->stream_len[local_3c];
                  }
                  else {
                    local_78 = acmod->fcb->sv_len[local_3c];
                  }
                  local_74 = local_78;
                }
                else {
                  local_74 = acmod->fcb->out_dim;
                }
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x350,"Dimension of stream %d does not match: %d != %d\n",
                        (ulong)(uint)s_00->g->featlen[local_3c],(ulong)local_74);
                goto LAB_0015ca1b;
              }
            }
            pcVar3 = ps_config_str(s_00->config,"sendump");
            if (pcVar3 == (char *)0x0) {
              pcVar3 = ps_config_str(s_00->config,"mixw");
              dVar8 = ps_config_float(s_00->config,"mixwfloor");
              iVar1 = read_mixw(s_00,pcVar3,dVar8);
            }
            else {
              iVar1 = read_sendump(s_00,acmod->mdef,pcVar3);
            }
            if (-1 < iVar1) {
              lVar5 = ps_config_int(s_00->config,"ds");
              s_00->ds_ratio = (int16)lVar5;
              lVar5 = ps_config_int(s_00->config,"topn");
              s_00->max_topn = (int16)lVar5;
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x362,"Maximum top-N: %d\n",(ulong)(uint)(int)s_00->max_topn);
              puVar6 = (uint8 *)__ckd_calloc__((long)s_00->n_sen,1,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                               ,0x366);
              s_00->sen2cb = puVar6;
              for (local_3c = 0; local_3c < s_00->n_sen; local_3c = local_3c + 1) {
                s_00->sen2cb[local_3c] = (uint8)acmod->mdef->sen2cimap[local_3c];
              }
              lVar5 = ps_config_int(s_00->config,"pl_window");
              s_00->n_fast_hist = (int)lVar5 + 2;
              ppVar7 = (ptm_fast_eval_t *)
                       __ckd_calloc__((long)s_00->n_fast_hist,0x10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                      ,0x36e);
              s_00->hist = ppVar7;
              s_00->f = s_00->hist;
              ptm_mgau_reset_fast_hist((ps_mgau_t *)s_00);
              (s_00->base).vt = &ptm_mgau_funcs;
              return &s_00->base;
            }
          }
          else {
            if (acmod->fcb->n_sv == 0) {
              local_60 = acmod->fcb->n_stream;
            }
            else {
              local_60 = acmod->fcb->n_sv;
            }
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                    ,0x34a,"Number of streams does not match: %d != %d\n",
                    (ulong)(uint)s_00->g->n_feat,(ulong)local_60);
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                  ,0x344,
                  "Number of codebooks doesn\'t match number of ciphones, doesn\'t look like PTM: %d != %d\n"
                  ,(ulong)(uint)s_00->g->n_mgau,(ulong)(uint)mdef->n_ciphone);
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x340,"Number of codebooks exceeds 256: %d\n",(ulong)(uint)s_00->g->n_mgau);
      }
    }
    else {
      logmath_get_base(s_00->lmath_8b);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
              ,0x330,"Log base %f is too small to represent add table in 8 bits\n");
    }
  }
LAB_0015ca1b:
  ptm_mgau_free((ps_mgau_t *)s_00);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
ptm_mgau_init(acmod_t *acmod, bin_mdef_t *mdef)
{
    ptm_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* We only support 256 codebooks or less (like 640k or 2GB, this
     * should be enough for anyone) */
    if (s->g->n_mgau > 256) {
        E_INFO("Number of codebooks exceeds 256: %d\n", s->g->n_mgau);
        goto error_out;
    }
    if (s->g->n_mgau != bin_mdef_n_ciphone(mdef)) {
        E_INFO("Number of codebooks doesn't match number of ciphones, doesn't look like PTM: %d != %d\n", s->g->n_mgau, bin_mdef_n_ciphone(mdef));
        goto error_out;
    }
    /* Verify n_feat and veclen, against acmod. */
    if (s->g->n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                s->g->n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < s->g->n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights. */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");
    s->max_topn = ps_config_int(s->config, "topn");
    E_INFO("Maximum top-N: %d\n", s->max_topn);

    /* Assume mapping of senones to their base phones, though this
     * will become more flexible in the future. */
    s->sen2cb = ckd_calloc(s->n_sen, sizeof(*s->sen2cb));
    for (i = 0; i < s->n_sen; ++i)
        s->sen2cb[i] = bin_mdef_sen2cimap(acmod->mdef, i);

    /* Allocate fast-match history buffers.  We need enough for the
     * phoneme lookahead window, plus the current frame, plus one for
     * good measure? (FIXME: I don't remember why) */
    s->n_fast_hist = ps_config_int(s->config, "pl_window") + 2;
    s->hist = ckd_calloc(s->n_fast_hist, sizeof(*s->hist));
    /* s->f will be a rotating pointer into s->hist. */
    s->f = s->hist;

    ps = (ps_mgau_t *)s;
    ptm_mgau_reset_fast_hist(ps);
    ps->vt = &ptm_mgau_funcs;
    return ps;
error_out:
    ptm_mgau_free(ps_mgau_base(s));
    return NULL;
}